

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  undefined8 uVar5;
  long lVar6;
  CURLM *curl;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  timeval newer;
  int success;
  timeval tv;
  timeval timeout;
  ReadWriteSockets sockets;
  fd_set writeSet;
  fd_set readSet;
  stat file_info;
  int local_20c;
  timeval local_208;
  timeval local_1f8;
  Sockets local_1e8;
  Sockets local_1d8;
  fd_set local_1c8;
  fd_set local_148;
  stat64 local_c0;
  
  local_1d8.sockets = (curl_socket_t *)0x0;
  local_1d8.count = 0;
  local_1d8.max_count = 0;
  local_1e8.sockets = (curl_socket_t *)0x0;
  local_1e8.count = 0;
  local_1e8.max_count = 0;
  local_1f8.tv_sec = -1;
  local_1f8.tv_usec = 0;
  local_20c = 0;
  tv_test_start = tutil_tvnow();
  if (libtest_arg3 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: lib582 [url] [filename] [username]\n");
    iVar2 = 0x76;
    goto LAB_0010263d;
  }
  __stream = fopen64(libtest_arg2,"rb");
  uVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    iVar2 = *piVar7;
    pcVar8 = strerror(iVar2);
    curl_mfprintf(uVar1,"fopen() failed with error: %d (%s)\n",iVar2,pcVar8);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg2);
    iVar2 = 0x75;
    goto LAB_0010263d;
  }
  iVar2 = fileno(__stream);
  iVar2 = fstat64(iVar2,&local_c0);
  uVar1 = _stderr;
  if (iVar2 == -1) {
    piVar7 = __errno_location();
    iVar2 = *piVar7;
    pcVar8 = strerror(iVar2);
    curl_mfprintf(uVar1,"fstat() failed with error: %d (%s)\n",iVar2,pcVar8);
    curl_mfprintf(_stderr,"ERROR: cannot open file (%s)\n",libtest_arg2);
    fclose(__stream);
    iVar2 = 0x74;
    goto LAB_0010263d;
  }
  curl_mfprintf(_stderr,"Set to upload %d bytes\n");
  iVar3 = curl_global_init(3);
  uVar1 = _stderr;
  iVar2 = 0;
  if (iVar3 != 0) {
    uVar5 = curl_easy_strerror(iVar3);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                  ,0x108,iVar3,uVar5);
    iVar2 = iVar3;
  }
  if (iVar2 != 0) {
    fclose(__stream);
    goto LAB_0010263d;
  }
  lVar6 = curl_easy_init();
  iVar2 = 0;
  if (lVar6 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                 );
    iVar2 = 0x7c;
  }
  if (lVar6 == 0) {
LAB_001025fa:
    curl = (CURLM *)0x0;
  }
  else {
    iVar3 = curl_easy_setopt(lVar6,0x2e,1);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar5 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                    ,0x111,iVar3,uVar5);
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      iVar3 = curl_easy_setopt(lVar6,0x2712,URL);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x114,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_001025fa;
      iVar3 = curl_easy_setopt(lVar6,0x29,1);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x117,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_00102599;
      iVar3 = curl_easy_setopt(lVar6,0x2719,__stream);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x11a,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_001025fa;
      iVar3 = curl_easy_setopt(lVar6,0x2715,libtest_arg3);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x11c,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_00102599;
      iVar3 = curl_easy_setopt(lVar6,0x27a8,"curl_client_key.pub");
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x11d,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_001025fa;
      iVar3 = curl_easy_setopt(lVar6,0x27a9,"curl_client_key");
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x11e,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_00102599;
      iVar3 = curl_easy_setopt(lVar6,0x51,0);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                      ,0x11f,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        iVar3 = curl_easy_setopt(lVar6,0x75a3,local_c0.st_size);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar5 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                        ,0x121,iVar3,uVar5);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          curl = (CURLM *)curl_multi_init();
          if (curl == (CURLM *)0x0) {
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                         );
            iVar2 = 0x7b;
          }
          else {
            iVar3 = curl_multi_setopt(curl,0x4e21,curlSocketCallback);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar5 = curl_multi_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                            ,0x125,iVar3,uVar5);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              iVar3 = curl_multi_setopt(curl,0x2712,&local_1e8);
              uVar1 = _stderr;
              iVar2 = 0;
              if (iVar3 != 0) {
                uVar5 = curl_multi_strerror(iVar3);
                curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                              ,0x126,iVar3,uVar5);
                iVar2 = iVar3;
              }
              if (iVar2 == 0) {
                iVar3 = curl_multi_setopt(curl,0x4e24,curlTimerCallback);
                uVar1 = _stderr;
                iVar2 = 0;
                if (iVar3 != 0) {
                  uVar5 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                                ,0x128,iVar3,uVar5);
                  iVar2 = iVar3;
                }
                if (iVar2 == 0) {
                  iVar3 = curl_multi_setopt(curl,0x2715,&local_1f8);
                  uVar1 = _stderr;
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    uVar5 = curl_multi_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                                  ,0x129,iVar3,uVar5);
                    iVar2 = iVar3;
                  }
                  if (iVar2 == 0) {
                    iVar2 = curl_multi_add_handle(curl,lVar6);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      iVar2 = 0;
                    }
                    else {
                      uVar5 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                                    ,299,iVar2,uVar5);
                    }
                    if (iVar2 == 0) {
                      iVar2 = 0;
                      do {
                        iVar3 = checkForCompletion(curl,&local_20c);
                        if (iVar3 != 0) {
                          if (local_20c == 0) {
                            curl_mfprintf(_stderr,"Error uploading file.\n");
                            iVar2 = 0x7e;
                          }
                          goto LAB_001025fc;
                        }
                        local_208.tv_sec = 10;
                        local_208.tv_usec = 0;
                        local_148.__fds_bits[0] = 0;
                        local_148.__fds_bits[1] = 0;
                        local_148.__fds_bits[2] = 0;
                        local_148.__fds_bits[3] = 0;
                        local_148.__fds_bits[4] = 0;
                        local_148.__fds_bits[5] = 0;
                        local_148.__fds_bits[6] = 0;
                        local_148.__fds_bits[7] = 0;
                        local_148.__fds_bits[8] = 0;
                        local_148.__fds_bits[9] = 0;
                        local_148.__fds_bits[10] = 0;
                        local_148.__fds_bits[0xb] = 0;
                        local_148.__fds_bits[0xc] = 0;
                        local_148.__fds_bits[0xd] = 0;
                        local_148.__fds_bits[0xe] = 0;
                        local_148.__fds_bits[0xf] = 0;
                        local_1c8.__fds_bits[0] = 0;
                        local_1c8.__fds_bits[1] = 0;
                        local_1c8.__fds_bits[2] = 0;
                        local_1c8.__fds_bits[3] = 0;
                        local_1c8.__fds_bits[4] = 0;
                        local_1c8.__fds_bits[5] = 0;
                        local_1c8.__fds_bits[6] = 0;
                        local_1c8.__fds_bits[7] = 0;
                        local_1c8.__fds_bits[8] = 0;
                        local_1c8.__fds_bits[9] = 0;
                        local_1c8.__fds_bits[10] = 0;
                        local_1c8.__fds_bits[0xb] = 0;
                        local_1c8.__fds_bits[0xc] = 0;
                        local_1c8.__fds_bits[0xd] = 0;
                        local_1c8.__fds_bits[0xe] = 0;
                        local_1c8.__fds_bits[0xf] = 0;
                        iVar3 = 0;
                        if (0 < (long)local_1e8.count) {
                          lVar9 = 0;
                          do {
                            iVar4 = local_1e8.sockets[lVar9];
                            iVar10 = iVar4 + 0x3f;
                            if (-1 < iVar4) {
                              iVar10 = iVar4;
                            }
                            local_148.__fds_bits[iVar10 >> 6] =
                                 local_148.__fds_bits[iVar10 >> 6] | 1L << ((byte)iVar4 & 0x3f);
                            if (iVar3 <= iVar4) {
                              iVar3 = iVar4 + 1;
                            }
                            lVar9 = lVar9 + 1;
                          } while (local_1e8.count != lVar9);
                        }
                        if (0 < (long)local_1d8.count) {
                          lVar9 = 0;
                          do {
                            iVar4 = local_1d8.sockets[lVar9];
                            iVar10 = iVar4 + 0x3f;
                            if (-1 < iVar4) {
                              iVar10 = iVar4;
                            }
                            local_1c8.__fds_bits[iVar10 >> 6] =
                                 local_1c8.__fds_bits[iVar10 >> 6] | 1L << ((byte)iVar4 & 0x3f);
                            if (iVar3 <= iVar4) {
                              iVar3 = iVar4 + 1;
                            }
                            lVar9 = lVar9 + 1;
                          } while (local_1d8.count != lVar9);
                        }
                        if (local_1f8.tv_sec == -1) {
                          if (iVar3 < 1) {
                            local_208.tv_sec = 0;
                            local_208.tv_usec = 100000;
                          }
                        }
                        else {
                          iVar4 = getMicroSecondTimeout(&local_1f8);
                          local_208.tv_sec = (__time_t)(iVar4 / 1000000);
                          local_208.tv_usec = (__suseconds_t)(iVar4 % 1000000);
                        }
                        iVar3 = select_wrapper(iVar3,&local_148,&local_1c8,(fd_set *)0x0,&local_208)
                        ;
                        if (iVar3 == -1) {
                          piVar7 = __errno_location();
                          uVar1 = _stderr;
                          iVar2 = *piVar7;
                          pcVar8 = strerror(iVar2);
                          curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                                        ,0x141,iVar2,pcVar8);
                          iVar2 = 0x79;
                        }
                        iVar3 = 10;
                        if (iVar2 == 0) {
                          checkFdSet(curl,&local_1e8,&local_148,1,"read");
                          checkFdSet(curl,&local_1d8,&local_1c8,2,"write");
                          if (local_1f8.tv_sec != -1) {
                            iVar2 = getMicroSecondTimeout(&local_1f8);
                            if (iVar2 == 0) {
                              notifyCurl(curl,-1,0,"timeout");
                            }
                          }
                          newer = tutil_tvnow();
                          lVar9 = tutil_tvdiff(newer,tv_test_start);
                          iVar3 = 0;
                          iVar2 = 0;
                          if (60000 < lVar9) {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib582.c"
                                          ,0x14c);
                            iVar2 = 0x7d;
                            iVar3 = 10;
                          }
                        }
                      } while (iVar3 == 0);
                      if (iVar3 != 10) goto LAB_0010263d;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          curl = (CURLM *)0x0;
        }
      }
      else {
        curl = (CURLM *)0x0;
      }
    }
    else {
LAB_00102599:
      curl = (CURLM *)0x0;
    }
  }
LAB_001025fc:
  curl_multi_remove_handle(curl,lVar6);
  curl_easy_cleanup(lVar6);
  curl_multi_cleanup(curl);
  curl_global_cleanup();
  fclose(__stream);
  free(local_1e8.sockets);
  free(local_1d8.sockets);
LAB_0010263d:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  FILE *hd_src = NULL;
  int hd;
  struct_stat file_info;
  CURLM *m = NULL;
  struct ReadWriteSockets sockets = {{NULL, 0, 0}, {NULL, 0, 0}};
  struct timeval timeout = {-1, 0};
  int success = 0;

  start_test_timing();

  if(!libtest_arg3) {
    fprintf(stderr, "Usage: lib582 [url] [filename] [username]\n");
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    fprintf(stderr, "fopen() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg2);
    return TEST_ERR_FOPEN;
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    fprintf(stderr, "fstat() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "ERROR: cannot open file (%s)\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_FSTAT;
  }
  fprintf(stderr, "Set to upload %d bytes\n", (int)file_info.st_size);

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(hd_src);
    return res;
  }

  easy_init(curl);

  /* enable uploading */
  easy_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* specify target */
  easy_setopt(curl, CURLOPT_URL, URL);

  /* go verbose */
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* now specify which file to upload */
  easy_setopt(curl, CURLOPT_READDATA, hd_src);

  easy_setopt(curl, CURLOPT_USERPWD, libtest_arg3);
  easy_setopt(curl, CURLOPT_SSH_PUBLIC_KEYFILE, "curl_client_key.pub");
  easy_setopt(curl, CURLOPT_SSH_PRIVATE_KEYFILE, "curl_client_key");
  easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0L);

  easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)file_info.st_size);

  multi_init(m);

  multi_setopt(m, CURLMOPT_SOCKETFUNCTION, curlSocketCallback);
  multi_setopt(m, CURLMOPT_SOCKETDATA, &sockets);

  multi_setopt(m, CURLMOPT_TIMERFUNCTION, curlTimerCallback);
  multi_setopt(m, CURLMOPT_TIMERDATA, &timeout);

  multi_add_handle(m, curl);

  while(!checkForCompletion(m, &success)) {
    fd_set readSet, writeSet;
    curl_socket_t maxFd = 0;
    struct timeval tv = {10, 0};

    FD_ZERO(&readSet);
    FD_ZERO(&writeSet);
    updateFdSet(&sockets.read, &readSet, &maxFd);
    updateFdSet(&sockets.write, &writeSet, &maxFd);

    if(timeout.tv_sec != -1) {
      int usTimeout = getMicroSecondTimeout(&timeout);
      tv.tv_sec = usTimeout / 1000000;
      tv.tv_usec = usTimeout % 1000000;
    }
    else if(maxFd <= 0) {
      tv.tv_sec = 0;
      tv.tv_usec = 100000;
    }

    select_test((int)maxFd, &readSet, &writeSet, NULL, &tv);

    /* Check the sockets for reading / writing */
    checkFdSet(m, &sockets.read, &readSet, CURL_CSELECT_IN, "read");
    checkFdSet(m, &sockets.write, &writeSet, CURL_CSELECT_OUT, "write");

    if(timeout.tv_sec != -1 && getMicroSecondTimeout(&timeout) == 0) {
      /* Curl's timer has elapsed. */
      notifyCurl(m, CURL_SOCKET_TIMEOUT, 0, "timeout");
    }

    abort_on_test_timeout();
  }

  if(!success) {
    fprintf(stderr, "Error uploading file.\n");
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  curl_multi_remove_handle(m, curl);
  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  /* close the local file */
  fclose(hd_src);

  /* free local memory */
  free(sockets.read.sockets);
  free(sockets.write.sockets);

  return res;
}